

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int mbedtls_cipher_setup(mbedtls_cipher_context_t *ctx,mbedtls_cipher_info_t *cipher_info)

{
  mbedtls_cipher_base_t *pmVar1;
  void *pvVar2;
  mbedtls_cipher_info_t *cipher_info_local;
  mbedtls_cipher_context_t *ctx_local;
  
  if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
    ctx_local._4_4_ = -0x6100;
  }
  else {
    memset(ctx,0,0x50);
    pmVar1 = mbedtls_cipher_get_base(cipher_info);
    pvVar2 = (*pmVar1->ctx_alloc_func)();
    ctx->cipher_ctx = pvVar2;
    if (pvVar2 == (void *)0x0) {
      ctx_local._4_4_ = -0x6180;
    }
    else {
      ctx->cipher_info = cipher_info;
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_setup(mbedtls_cipher_context_t *ctx,
                         const mbedtls_cipher_info_t *cipher_info)
{
    if (cipher_info == NULL) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    memset(ctx, 0, sizeof(mbedtls_cipher_context_t));

    if (NULL == (ctx->cipher_ctx = mbedtls_cipher_get_base(cipher_info)->ctx_alloc_func())) {
        return MBEDTLS_ERR_CIPHER_ALLOC_FAILED;
    }

    ctx->cipher_info = cipher_info;

    return 0;
}